

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmWorkerPool.cxx
# Opt level: O2

void cmWorkerPoolInternal::UVSlotBegin(uv_async_t *handle)

{
  uint uVar1;
  cmWorkerPoolInternal *pcVar2;
  __uniq_ptr_impl<cmWorkerPoolWorker,_std::default_delete<cmWorkerPoolWorker>_> _Var3;
  int iVar4;
  uint local_54;
  code *local_50;
  uint local_48;
  undefined4 uStack_44;
  cmWorkerPoolInternal *local_40;
  ulong __n;
  
  pcVar2 = (cmWorkerPoolInternal *)handle->data;
  uVar1 = pcVar2->Pool->ThreadCount_;
  __n = (ulong)uVar1;
  std::
  vector<std::unique_ptr<cmWorkerPoolWorker,_std::default_delete<cmWorkerPoolWorker>_>,_std::allocator<std::unique_ptr<cmWorkerPoolWorker,_std::default_delete<cmWorkerPoolWorker>_>_>_>
  ::reserve(&pcVar2->Workers,__n);
  while (iVar4 = (int)__n, __n = (ulong)(iVar4 - 1), iVar4 != 0) {
    std::make_unique<cmWorkerPoolWorker,uv_loop_s&>((uv_loop_s *)&stack0xffffffffffffffb0);
    std::
    vector<std::unique_ptr<cmWorkerPoolWorker,std::default_delete<cmWorkerPoolWorker>>,std::allocator<std::unique_ptr<cmWorkerPoolWorker,std::default_delete<cmWorkerPoolWorker>>>>
    ::emplace_back<std::unique_ptr<cmWorkerPoolWorker,std::default_delete<cmWorkerPoolWorker>>>
              ((vector<std::unique_ptr<cmWorkerPoolWorker,std::default_delete<cmWorkerPoolWorker>>,std::allocator<std::unique_ptr<cmWorkerPoolWorker,std::default_delete<cmWorkerPoolWorker>>>>
                *)&pcVar2->Workers,
               (unique_ptr<cmWorkerPoolWorker,_std::default_delete<cmWorkerPoolWorker>_> *)
               &stack0xffffffffffffffb0);
    std::unique_ptr<cmWorkerPoolWorker,_std::default_delete<cmWorkerPoolWorker>_>::~unique_ptr
              ((unique_ptr<cmWorkerPoolWorker,_std::default_delete<cmWorkerPoolWorker>_> *)
               &stack0xffffffffffffffb0);
  }
  for (local_54 = 0; local_54 != uVar1; local_54 = local_54 + 1) {
    _Var3._M_t.
    super__Tuple_impl<0UL,_cmWorkerPoolWorker_*,_std::default_delete<cmWorkerPoolWorker>_>.
    super__Head_base<0UL,_cmWorkerPoolWorker_*,_false>._M_head_impl =
         (pcVar2->Workers).
         super__Vector_base<std::unique_ptr<cmWorkerPoolWorker,_std::default_delete<cmWorkerPoolWorker>_>,_std::allocator<std::unique_ptr<cmWorkerPoolWorker,_std::default_delete<cmWorkerPoolWorker>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[local_54]._M_t.
         super___uniq_ptr_impl<cmWorkerPoolWorker,_std::default_delete<cmWorkerPoolWorker>_>._M_t;
    local_50 = Work;
    local_48 = 0;
    uStack_44 = 0;
    local_40 = pcVar2;
    std::thread::
    thread<void(cmWorkerPoolInternal::*)(unsigned_int),cmWorkerPoolInternal*,unsigned_int&,void>
              ((thread *)&stack0xffffffffffffffc8,(type *)&stack0xffffffffffffffb0,
               &stack0xffffffffffffffc0,&local_54);
    std::thread::operator=
              ((thread *)
               ((long)_Var3._M_t.
                      super__Tuple_impl<0UL,_cmWorkerPoolWorker_*,_std::default_delete<cmWorkerPoolWorker>_>
                      .super__Head_base<0UL,_cmWorkerPoolWorker_*,_false>._M_head_impl + 0x70),
               (thread *)&stack0xffffffffffffffc8);
    std::thread::~thread((thread *)&stack0xffffffffffffffc8);
  }
  ::cm::uv_handle_ptr_base_<uv_async_s>::reset
            ((uv_handle_ptr_base_<uv_async_s> *)&pcVar2->UVRequestBegin);
  return;
}

Assistant:

void cmWorkerPoolInternal::UVSlotBegin(uv_async_t* handle)
{
  auto& gint = *reinterpret_cast<cmWorkerPoolInternal*>(handle->data);
  // Create worker threads
  {
    unsigned int const num = gint.Pool->ThreadCount();
    // Create workers
    gint.Workers.reserve(num);
    for (unsigned int ii = 0; ii != num; ++ii) {
      gint.Workers.emplace_back(
        cm::make_unique<cmWorkerPoolWorker>(*gint.UVLoop));
    }
    // Start worker threads
    for (unsigned int ii = 0; ii != num; ++ii) {
      gint.Workers[ii]->SetThread(
        std::thread(&cmWorkerPoolInternal::Work, &gint, ii));
    }
  }
  // Destroy begin request
  gint.UVRequestBegin.reset();
}